

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prometheus.cc
# Opt level: O2

void __thiscall
instrumentation::anon_unknown_0::prom_collector::write_<double>
          (prom_collector *this,metric_name *name,tags *t,double *v,char *metric_type)

{
  double dVar1;
  ostream *poVar2;
  char *pcVar3;
  string pm_name;
  string sStack_48;
  
  (anonymous_namespace)::prom_collector::prom_metric_name_abi_cxx11_
            (&sStack_48,(prom_collector *)name,(metric_name *)t);
  if ((this->pending_help).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    if ((this->pending_help).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length != 0) {
      poVar2 = std::operator<<(this->out,"# HELP ");
      poVar2 = std::operator<<(poVar2,(string *)&sStack_48);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,(string *)&this->pending_help);
      std::operator<<(poVar2,"\n");
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&this->pending_help);
    poVar2 = std::operator<<(this->out,"# TYPE ");
    poVar2 = std::operator<<(poVar2,(string *)&sStack_48);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,metric_type);
    std::operator<<(poVar2,"\n");
  }
  poVar2 = std::operator<<(this->out,(string *)&sStack_48);
  std::operator<<(poVar2,"\t");
  write_tags_(this,t);
  dVar1 = *v;
  if (NAN(dVar1)) {
    poVar2 = this->out;
    pcVar3 = "\"NaN\"";
  }
  else {
    poVar2 = this->out;
    if (ABS(dVar1) != INFINITY) {
      std::ostream::_M_insert<double>(dVar1);
      goto LAB_00128fc8;
    }
    pcVar3 = "+Inf";
    if (dVar1 < 0.0) {
      pcVar3 = "-Inf";
    }
  }
  std::operator<<(poVar2,pcVar3);
LAB_00128fc8:
  std::operator<<(this->out,"\n");
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void write_(const metric_name& name, const tags& t, const T& v, const char* metric_type = "untyped") {
    const auto pm_name = prom_metric_name(name);

    if (pending_help) {
      if (!pending_help->empty())
        out << "# HELP " << pm_name << " " << *pending_help << "\n";
      pending_help.reset();
      out << "# TYPE " << pm_name << " " << metric_type << "\n";
    }

    out << pm_name << "\t";
    write_tags_(t);

    if constexpr(std::is_floating_point_v<T>) {
      // For floating point, ensure we handle the edge cases correctly.
      if (std::isnan(v)) {
        out << R"("NaN")";
      } else if (std::isinf(v)) {
        out << (v < 0 ? R"(-Inf)" : R"(+Inf)");
      } else {
        out << v;
      }
    } else {
      out << v;
    }

    out << "\n";
  }